

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O3

void __thiscall
GlobOptBlockData::RemoveUnavailableCandidates(GlobOptBlockData *this,PRECandidates *candidates)

{
  ValueNumber VVar1;
  Sym *sym;
  Sym *sym_00;
  Type this_00;
  code *pcVar2;
  SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::JitArenaAllocator,_RealCount> *buffer;
  NodeBase *pNVar3;
  bool bVar4;
  BOOLEAN BVar5;
  undefined4 *puVar6;
  Type *ppHVar7;
  Value *pVVar8;
  undefined1 local_58 [8];
  EditingIterator iter;
  
  local_58 = (undefined1  [8])candidates->candidatesList;
  iter.super_EditingIterator.super_Iterator.current = (NodeBase *)0x0;
  iter.super_EditingIterator.super_Iterator.list =
       (SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::JitArenaAllocator,_RealCount> *)local_58;
  iter.super_EditingIterator.last = (NodeBase *)candidates;
  bVar4 = SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::JitArenaAllocator,_RealCount>::
          EditingIterator::Next((EditingIterator *)local_58);
  if (bVar4) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      ppHVar7 = SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::JitArenaAllocator,_RealCount>::
                Iterator::Data((Iterator *)local_58);
      pVVar8 = (*ppHVar7)->element;
      sym = (*ppHVar7)->value;
      if (sym->m_kind != SymKindProperty) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
        if (!bVar4) goto LAB_0049008b;
        *puVar6 = 0;
      }
      VVar1 = pVVar8->valueNumber;
      sym_00 = pVVar8->valueInfo->symStore;
      pVVar8 = FindValue(this,sym);
      if ((((pVVar8 == (Value *)0x0) || (pVVar8->valueNumber != VVar1)) ||
          (pVVar8->valueInfo->symStore != sym_00)) ||
         ((pVVar8 = FindValue(this,sym_00), pVVar8 == (Value *)0x0 || (pVVar8->valueNumber != VVar1)
          ))) {
        buffer = iter.super_EditingIterator.super_Iterator.list;
        this_00 = *(Type *)((long)local_58 + 0x10);
        SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::JitArenaAllocator,_RealCount>::
        EditingIterator::UnlinkCurrentNode((EditingIterator *)local_58);
        Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                  ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this_00,
                   buffer,0x10);
        pNVar3 = iter.super_EditingIterator.last;
        BVar5 = BVSparse<Memory::JitArenaAllocator>::Test
                          ((BVSparse<Memory::JitArenaAllocator> *)
                           (iter.super_EditingIterator.last)->next,sym->m_id);
        if (BVar5 == '\0') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                             ,0x16d,
                             "(candidates->candidatesToProcess->Test(candidatePropertySym->m_id))",
                             "candidates->candidatesToProcess->Test(candidatePropertySym->m_id)");
          if (!bVar4) {
LAB_0049008b:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar6 = 0;
        }
        BVSparse<Memory::JitArenaAllocator>::Clear
                  ((BVSparse<Memory::JitArenaAllocator> *)pNVar3->next,sym->m_id);
      }
      bVar4 = SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::JitArenaAllocator,_RealCount>::
              EditingIterator::Next((EditingIterator *)local_58);
    } while (bVar4);
  }
  return;
}

Assistant:

void GlobOptBlockData::RemoveUnavailableCandidates(PRECandidates * candidates)
{
    // In case of multiple back-edges to the loop, make sure the candidates are still valid.
    FOREACH_SLIST_ENTRY_EDITING(GlobHashBucket*, candidate, candidates->candidatesList, iter)
    {
        Value *candidateValue = candidate->element;
        PropertySym *candidatePropertySym = candidate->value->AsPropertySym();
        ValueNumber valueNumber = candidateValue->GetValueNumber();
        Sym *symStore = candidateValue->GetValueInfo()->GetSymStore();

        Value *blockValue = this->FindValue(candidatePropertySym);

        if (blockValue && blockValue->GetValueNumber() == valueNumber
            && blockValue->GetValueInfo()->GetSymStore() == symStore)
        {
            Value *symStoreValue = this->FindValue(symStore);

            if (symStoreValue && symStoreValue->GetValueNumber() == valueNumber)
            {
                continue;
            }
        }

        iter.RemoveCurrent();
        Assert(candidates->candidatesToProcess->Test(candidatePropertySym->m_id));
        candidates->candidatesToProcess->Clear(candidatePropertySym->m_id);
    } NEXT_SLIST_ENTRY_EDITING;
}